

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_iterator.cpp
# Opt level: O2

void __thiscall
duckdb::BoundNodeVisitor::VisitBoundTableRef(BoundNodeVisitor *this,BoundTableRef *ref)

{
  pointer pvVar1;
  pointer puVar2;
  BoundTableFunction *pBVar3;
  type op;
  type pBVar4;
  BoundExpressionListRef *pBVar5;
  BoundSubqueryRef *pBVar6;
  BoundJoinRef *pBVar7;
  type pBVar8;
  type pBVar9;
  NotImplementedException *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  pointer puVar10;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *expr_list;
  pointer pvVar11;
  allocator local_71;
  LogicalBoundNodeVisitor node_visitor;
  string local_50;
  
  switch(ref->type) {
  case BASE_TABLE:
  case CTE:
  case EMPTY_FROM:
    break;
  case SUBQUERY:
    pBVar6 = BoundTableRef::Cast<duckdb::BoundSubqueryRef>(ref);
    pBVar9 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator*(&pBVar6->subquery);
    UNRECOVERED_JUMPTABLE = this->_vptr_BoundNodeVisitor[2];
    goto LAB_01645e2c;
  case JOIN:
    pBVar7 = BoundTableRef::Cast<duckdb::BoundJoinRef>(ref);
    if ((pBVar7->condition).
        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
        super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
        super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
      (*this->_vptr_BoundNodeVisitor[4])(this,&pBVar7->condition);
    }
    pBVar8 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
             operator*(&pBVar7->left);
    (*this->_vptr_BoundNodeVisitor[3])(this,pBVar8);
    pBVar9 = (type)unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                   ::operator*(&pBVar7->right);
    UNRECOVERED_JUMPTABLE = this->_vptr_BoundNodeVisitor[3];
LAB_01645e2c:
    (*UNRECOVERED_JUMPTABLE)(this,pBVar9);
    return;
  default:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&node_visitor,
               "Unimplemented table reference type (%s) in ExpressionIterator",&local_71);
    EnumUtil::ToString<duckdb::TableReferenceType>(&local_50,ref->type);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)&node_visitor,&local_50);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case TABLE_FUNCTION:
    pBVar3 = BoundTableRef::Cast<duckdb::BoundTableFunction>(ref);
    node_visitor.super_LogicalOperatorVisitor._vptr_LogicalOperatorVisitor =
         (_func_int **)&PTR__LogicalOperatorVisitor_027a6a40;
    node_visitor.parent = this;
    if ((pBVar3->get).
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      op = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator*(&pBVar3->get);
      LogicalOperatorVisitor::VisitOperator(&node_visitor.super_LogicalOperatorVisitor,op);
    }
    if ((pBVar3->subquery).
        super_unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::BoundSubqueryRef_*,_std::default_delete<duckdb::BoundSubqueryRef>_>
        .super__Head_base<0UL,_duckdb::BoundSubqueryRef_*,_false>._M_head_impl !=
        (BoundSubqueryRef *)0x0) {
      pBVar4 = unique_ptr<duckdb::BoundSubqueryRef,_std::default_delete<duckdb::BoundSubqueryRef>,_true>
               ::operator*(&pBVar3->subquery);
      (*this->_vptr_BoundNodeVisitor[3])(this,pBVar4);
    }
    break;
  case EXPRESSION_LIST:
    pBVar5 = BoundTableRef::Cast<duckdb::BoundExpressionListRef>(ref);
    pvVar1 = (pBVar5->values).
             super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
             .
             super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar11 = (pBVar5->values).
                   super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                   .
                   super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pvVar11 != pvVar1;
        pvVar11 = pvVar11 + 1) {
      puVar2 = (pvVar11->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ).
               super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar10 = (pvVar11->
                     super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ).
                     super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar10 != puVar2;
          puVar10 = puVar10 + 1) {
        (*this->_vptr_BoundNodeVisitor[4])(this,puVar10);
      }
    }
  }
  return;
}

Assistant:

void BoundNodeVisitor::VisitBoundTableRef(BoundTableRef &ref) {
	switch (ref.type) {
	case TableReferenceType::EXPRESSION_LIST: {
		auto &bound_expr_list = ref.Cast<BoundExpressionListRef>();
		for (auto &expr_list : bound_expr_list.values) {
			for (auto &expr : expr_list) {
				VisitExpression(expr);
			}
		}
		break;
	}
	case TableReferenceType::JOIN: {
		auto &bound_join = ref.Cast<BoundJoinRef>();
		if (bound_join.condition) {
			VisitExpression(bound_join.condition);
		}
		VisitBoundTableRef(*bound_join.left);
		VisitBoundTableRef(*bound_join.right);
		break;
	}
	case TableReferenceType::SUBQUERY: {
		auto &bound_subquery = ref.Cast<BoundSubqueryRef>();
		VisitBoundQueryNode(*bound_subquery.subquery);
		break;
	}
	case TableReferenceType::TABLE_FUNCTION: {
		auto &bound_table_function = ref.Cast<BoundTableFunction>();
		LogicalBoundNodeVisitor node_visitor(*this);
		if (bound_table_function.get) {
			node_visitor.VisitOperator(*bound_table_function.get);
		}
		if (bound_table_function.subquery) {
			VisitBoundTableRef(*bound_table_function.subquery);
		}
		break;
	}
	case TableReferenceType::EMPTY_FROM:
	case TableReferenceType::BASE_TABLE:
	case TableReferenceType::CTE:
		break;
	default:
		throw NotImplementedException("Unimplemented table reference type (%s) in ExpressionIterator",
		                              EnumUtil::ToString(ref.type));
	}
}